

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O0

void re_putliteral(EditLine *el,wchar_t *begin,wchar_t *end)

{
  wchar_t local_38;
  wchar_t local_34;
  wchar_t w;
  wchar_t i;
  wchar_t sizeh;
  wint_t c;
  coord_t *cur;
  wchar_t *end_local;
  wchar_t *begin_local;
  EditLine *el_local;
  
  _sizeh = &el->el_refresh;
  w = (el->el_terminal).t_size.h;
  cur = (coord_t *)end;
  end_local = begin;
  begin_local = (wchar_t *)el;
  i = literal_add(el,begin,end,&local_38);
  if ((i != L'\0') && (L'\0' < local_38)) {
    *(wchar_t *)
     (*(long *)(*(long *)(begin_local + 0x10) + (long)(_sizeh->r_cursor).v * 8) +
     (long)(_sizeh->r_cursor).h * 4) = i;
    local_34 = local_38;
    if (w - (_sizeh->r_cursor).h < local_38) {
      local_34 = w - (_sizeh->r_cursor).h;
    }
    while (local_34 = local_34 + L'\xffffffff', L'\0' < local_34) {
      *(undefined4 *)
       (*(long *)(*(long *)(begin_local + 0x10) + (long)(_sizeh->r_cursor).v * 8) +
       (long)((_sizeh->r_cursor).h + local_34) * 4) = 0xffffffff;
    }
    (_sizeh->r_cursor).h = local_38 + (_sizeh->r_cursor).h;
    if (w <= (_sizeh->r_cursor).h) {
      *(undefined4 *)
       (*(long *)(*(long *)(begin_local + 0x10) + (long)(_sizeh->r_cursor).v * 8) + (long)w * 4) = 0
      ;
      re_nextline((EditLine *)begin_local);
    }
  }
  return;
}

Assistant:

libedit_private void
re_putliteral(EditLine *el, const wchar_t *begin, const wchar_t *end)
{
	coord_t *cur = &el->el_refresh.r_cursor;
	wint_t c;
	int sizeh = el->el_terminal.t_size.h;
	int i, w;

	c = literal_add(el, begin, end, &w);
	if (c == 0 || w <= 0)
		return;
	el->el_vdisplay[cur->v][cur->h] = c;

	i = w;
	if (i > sizeh - cur->h)		/* avoid overflow */
		i = sizeh - cur->h;
	while (--i > 0)
		el->el_vdisplay[cur->v][cur->h + i] = MB_FILL_CHAR;

	cur->h += w;
	if (cur->h >= sizeh) {
		/* assure end of line */
		el->el_vdisplay[cur->v][sizeh] = '\0';
		re_nextline(el);
	}
}